

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

ostream * __thiscall GEO::Logger::err_stream(Logger *this,string *feature)

{
  bool bVar1;
  
  if (this->quiet_ == false) {
    bVar1 = std::operator!=(&this->current_feature_,feature);
    if (bVar1) {
      this->current_feature_changed_ = true;
      std::__cxx11::string::_M_assign((string *)&this->current_feature_);
    }
  }
  return &(this->err_).super_ostream;
}

Assistant:

std::ostream& Logger::err_stream(const std::string& feature) {
        if(!quiet_ && current_feature_ != feature) {
            current_feature_changed_ = true;
            current_feature_ = feature;
        }
        return err_;
    }